

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O0

stumpless_element * stumpless_new_element(char *name)

{
  _Bool _Var1;
  stumpless_element *element_00;
  stumpless_element *result;
  stumpless_element *element;
  size_t name_length;
  char *name_local;
  
  name_length = (size_t)name;
  if (name == (char *)0x0) {
    raise_argument_empty("name was NULL");
    name_local = (char *)0x0;
  }
  else {
    _Var1 = validate_element_name(name,(size_t *)&element);
    if (_Var1) {
      element_00 = (stumpless_element *)alloc_mem(0x48);
      if (element_00 == (stumpless_element *)0x0) {
        name_local = (char *)0x0;
      }
      else {
        clear_error();
        name_local = unchecked_load_element(element_00,(char *)name_length,(size_t)element)->name;
        if ((stumpless_element *)name_local == (stumpless_element *)0x0) {
          free_mem(element_00);
        }
      }
    }
    else {
      name_local = (char *)0x0;
    }
  }
  return (stumpless_element *)name_local;
}

Assistant:

struct stumpless_element *
stumpless_new_element( const char *name ) {
  size_t name_length;
  struct stumpless_element *element;
  struct stumpless_element *result;

  VALIDATE_ARG_NOT_NULL( name );

  if( unlikely( !validate_element_name( name, &name_length ) ) ) {
    return NULL;
  }

  element = alloc_mem( sizeof( *element ) );
  if( unlikely( !element ) ) {
    return NULL;
  }

  clear_error(  );

  result = unchecked_load_element( element, name, name_length );
  if( !result ) {
    free_mem( element );
  }

  return result;
}